

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

void __thiscall mognetwork::TcpSocket::~TcpSocket(TcpSocket *this)

{
  undefined8 *in_RDI;
  Mutex *in_stack_fffffffffffffff0;
  
  *in_RDI = &PTR__TcpSocket_00126c70;
  if ((in_RDI[0x13] != 0) && ((long *)in_RDI[0x13] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[0x13] + 8))();
  }
  Mutex::~Mutex(in_stack_fffffffffffffff0);
  ReadedDatas::~ReadedDatas((ReadedDatas *)0x11d960);
  std::__cxx11::
  list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  ::~list((list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
           *)0x11d970);
  Socket::~Socket((Socket *)0x11d97c);
  return;
}

Assistant:

TcpSocket::~TcpSocket()
  {
    if (m_protocolListener != NULL)
      delete m_protocolListener;
  }